

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding_validators.h
# Opt level: O0

bool cppcms::encoding::iso_8859_8_valid<char_const*>(char *p,char *e,size_t *count)

{
  uint uVar1;
  char *pcVar2;
  uint c;
  size_t *count_local;
  char *e_local;
  char *p_local;
  
  p_local = p;
  while( true ) {
    do {
      if (p_local == e) {
        return true;
      }
      *count = *count + 1;
      pcVar2 = p_local + 1;
      uVar1 = (uint)(byte)*p_local;
      p_local = pcVar2;
    } while (((uVar1 == 9) || (uVar1 == 10)) || (uVar1 == 0xd));
    if ((uVar1 < 0x20) || ((0x7e < uVar1 && (uVar1 < 0xa0)))) break;
    if (((uVar1 == 0xa1) || (uVar1 - 0xfb < 2)) || (uVar1 == 0xff)) {
      return false;
    }
    if ((0xbe < uVar1) && (uVar1 < 0xdf)) {
      return false;
    }
  }
  return false;
}

Assistant:

bool iso_8859_8_valid(Iterator p,Iterator e,size_t &count)
	{
		while(p!=e) {
			count++;
			unsigned c=(unsigned char)*p++;
			if(c==0x09 || c==0xA || c==0xD)
				continue;
			if(c<0x20 || (0x7F<=c && c<0xA0))
				return false;
			switch(c) {
			case 0xA1:
			case 0xFB:
			case 0xFC:
			case 0xFF:
				return false;
			}
			if(0xBF <=c && c<=0xDE)
				return false;
		}
		return true;
	}